

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::mousePressEvent(Stepper *this,QMouseEvent *event)

{
  QTimer *pQVar1;
  MouseButton MVar2;
  Button BVar3;
  StepperPrivate *pSVar4;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QPoint *pos;
  QPoint local_20;
  QEvent *local_18;
  QMouseEvent *event_local;
  Stepper *this_local;
  
  local_18 = (QEvent *)event;
  event_local = (QMouseEvent *)this;
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar2 == LeftButton) {
    QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>::
    operator->(&this->d);
    QTimer::stop();
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    pSVar4->autorepeatCount = 0;
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    pSVar4->timeout = 500;
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    local_20 = QMouseEvent::pos((QMouseEvent *)local_18);
    pos = &local_20;
    BVar3 = StepperPrivate::buttonPressed(pSVar4,pos);
    __fd = (int)pos;
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    __addr_len = (socklen_t *)(ulong)BVar3;
    pSVar4->button = BVar3;
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    StepperPrivate::makeClick(pSVar4);
    pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    __addr = extraout_RDX;
    if ((pSVar4->autorepeat & 1U) != 0) {
      pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
               ::operator->(&this->d);
      pQVar1 = pSVar4->timer;
      pSVar4 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
               ::operator->(&this->d);
      __fd = pSVar4->timeout;
      QTimer::start((int)pQVar1);
      __addr = extraout_RDX_00;
    }
    QEvent::accept(local_18,__fd,__addr,__addr_len);
  }
  else {
    QEvent::ignore(local_18);
  }
  return;
}

Assistant:

void
Stepper::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->timer->stop();

		d->autorepeatCount = 0;
		d->timeout = defaultTimeout;

		d->button = d->buttonPressed( event->pos() );

		d->makeClick();

		if( d->autorepeat )
			d->timer->start( d->timeout );

		event->accept();
	}
	else
		event->ignore();
}